

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RationalNum.cpp
# Opt level: O0

void __thiscall RationalNum::RationalNum(RationalNum *this,double x)

{
  ostream *poVar1;
  double dVar2;
  long local_20;
  longlong i;
  double x_local;
  RationalNum *this_local;
  
  for (local_20 = 1;
      (dVar2 = x * (double)local_20 + -(double)(long)(x * (double)local_20), dVar2 != 0.0 ||
      (NAN(dVar2))); local_20 = local_20 * 10) {
    if (0xccccccc < local_20) {
      poVar1 = std::operator<<((ostream *)&std::cout,"this frational number : ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
      poVar1 = std::operator<<(poVar1,
                               " can not be transfer to rational number, it\'s too long, now set it 0."
                              );
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      setNumerator(this,0);
      setDenominator(this,1);
      return;
    }
  }
  setNumerator(this,(long)(x * (double)local_20));
  setDenominator(this,local_20);
  simplify(this);
  return;
}

Assistant:

RationalNum::RationalNum(double x) {
    long long int i = 1;
    while (x * i - static_cast<long long int>(x * i) != 0) {
        if (i > INT_MAX / 10) {
            cout << "this frational number : " << x
                 << " can not be transfer to rational number, it's too long, now set it 0." << endl;
            setNumerator(0);
            setDenominator(1);
            return;
        } else {
            i *= 10;
        }
    }
    setNumerator(x * i);
    setDenominator(i);
    simplify();
}